

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

int main(int argc,char **argv)

{
  undefined *puVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_8;
  ostringstream error_message_7;
  DataTransformWrapper data_transform;
  string output_data_type;
  int in_stack_0000047c;
  string *in_stack_00000480;
  string *in_stack_00000488;
  string *in_stack_00000490;
  string input_data_type;
  istream *input_stream;
  ostringstream error_message_6;
  ifstream ifs;
  ostringstream error_message_5;
  ostringstream error_message_4;
  ostringstream error_message_3;
  string str;
  char *arg;
  int i;
  char *input_file;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int tmp;
  int max;
  int min;
  int option_char;
  string data_types;
  string print_format;
  int num_column;
  WarningType warning_type;
  bool rounding_flag;
  undefined4 in_stack_ffffffffffffec78;
  undefined4 in_stack_ffffffffffffec7c;
  DataTransformWrapper *in_stack_ffffffffffffec80;
  string *in_stack_ffffffffffffec88;
  allocator *paVar8;
  undefined4 in_stack_ffffffffffffec90;
  int in_stack_ffffffffffffec94;
  char *local_1358;
  bool local_12d2;
  byte local_1292;
  allocator local_1251;
  string local_1250 [32];
  ostringstream local_1230 [152];
  ostringstream *in_stack_ffffffffffffee68;
  string *in_stack_ffffffffffffee70;
  allocator local_10b1;
  string local_10b0 [32];
  ostream *in_stack_ffffffffffffef70;
  DataTransformWrapper local_f18;
  string local_f10 [32];
  string local_ef0 [32];
  char *local_ed0;
  allocator local_ec1;
  string local_ec0 [32];
  ostringstream local_ea0 [376];
  char local_d28 [527];
  allocator local_b19;
  string local_b18 [32];
  ostringstream local_af8 [383];
  allocator local_979;
  string local_978 [32];
  ostringstream local_958 [383];
  allocator local_7d9;
  string local_7d8 [32];
  ostringstream local_7b8 [376];
  string local_640 [39];
  allocator local_619;
  string local_618 [32];
  char *local_5f8;
  int local_5ec;
  char *local_5e8;
  allocator local_5d9;
  string local_5d8 [32];
  ostringstream local_5b8 [376];
  string local_440 [39];
  allocator local_419;
  string local_418 [32];
  ostringstream local_3f8 [383];
  allocator local_279;
  string local_278 [32];
  int local_258;
  allocator local_251;
  string local_250 [32];
  ostringstream local_230 [383];
  allocator local_b1;
  string local_b0 [36];
  int local_8c;
  undefined4 local_88;
  undefined4 local_84;
  int local_80;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  int local_18;
  undefined1 local_11;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_11 = 0;
  local_18 = 2;
  local_1c = 1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  puVar1 = (anonymous_namespace)::kDefaultDataTypes;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,puVar1,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
LAB_0010a79f:
  local_80 = ya_getopt_long(in_stack_ffffffffffffec94,(char **)in_stack_ffffffffffffec88,
                            (char *)in_stack_ffffffffffffec80,
                            (option *)CONCAT44(in_stack_ffffffffffffec7c,in_stack_ffffffffffffec78),
                            (int *)0x10a7c2);
  pcVar2 = ya_optarg;
  if (local_80 == -1) {
    local_5e8 = (char *)0x0;
    local_5ec = local_8 - ya_optind;
    goto LAB_0010afd4;
  }
  switch(local_80) {
  case 99:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,pcVar2,&local_279);
    bVar3 = sptk::ConvertStringToInteger(in_stack_ffffffffffffec88,(int *)in_stack_ffffffffffffec80)
    ;
    local_12d2 = !bVar3 || local_1c < 1;
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    if (local_12d2) {
      std::__cxx11::ostringstream::ostringstream(local_3f8);
      std::operator<<((ostream *)local_3f8,
                      "The argument for the -c option must be a positive integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_418,"x2x",&local_419);
      sptk::PrintErrorMessage(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      local_4 = 1;
      local_258 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_3f8);
      goto LAB_0010badf;
    }
    goto LAB_0010a79f;
  default:
    anon_unknown.dwarf_1a9d::PrintUsage(in_stack_ffffffffffffef70);
    local_4 = 1;
    local_258 = 1;
    goto LAB_0010badf;
  case 0x65:
    local_84 = 0;
    local_88 = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar2,&local_b1);
    bVar3 = sptk::ConvertStringToInteger(in_stack_ffffffffffffec88,(int *)in_stack_ffffffffffffec80)
    ;
    local_1292 = 1;
    if (bVar3) {
      bVar3 = sptk::IsInRange(local_8c,0,2);
      local_1292 = bVar3 ^ 0xff;
    }
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    if ((local_1292 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_230);
      poVar7 = std::operator<<((ostream *)local_230,
                               "The argument for the -e option must be an integer ");
      poVar7 = std::operator<<(poVar7,"in the range of ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
      poVar7 = std::operator<<(poVar7," to ");
      std::ostream::operator<<(poVar7,2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,"x2x",&local_251);
      sptk::PrintErrorMessage(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      local_4 = 1;
      local_258 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_230);
      goto LAB_0010badf;
    }
    local_18 = local_8c;
    goto LAB_0010a79f;
  case 0x66:
    goto switchD_0010a884_caseD_66;
  case 0x68:
    anon_unknown.dwarf_1a9d::PrintUsage(in_stack_ffffffffffffef70);
    local_4 = 0;
    local_258 = 1;
    goto LAB_0010badf;
  case 0x72:
    local_11 = 1;
    goto LAB_0010a79f;
  }
LAB_0010afd4:
  if (local_5ec < 1) goto LAB_0010b3cf;
  local_5f8 = *(char **)(local_10 + (long)(local_8 - local_5ec) * 8);
  iVar5 = strncmp(local_5f8,"+",1);
  pcVar2 = local_5f8;
  if (iVar5 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_618,pcVar2,&local_619);
    std::allocator<char>::~allocator((allocator<char> *)&local_619);
    std::__cxx11::string::substr((ulong)local_640,(ulong)local_618);
    std::__cxx11::string::operator=(local_78,local_640);
    std::__cxx11::string::~string(local_640);
    lVar6 = std::__cxx11::string::size();
    if (lVar6 == 2) {
      local_258 = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_7b8);
      std::operator<<((ostream *)local_7b8,"The +type option must be two characters");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7d8,"x2x",&local_7d9);
      sptk::PrintErrorMessage(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      std::__cxx11::string::~string(local_7d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
      local_4 = 1;
      local_258 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_7b8);
    }
    std::__cxx11::string::~string(local_618);
    if (local_258 != 0) goto LAB_0010badf;
  }
  else {
    if (local_5e8 != (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_958);
      std::operator<<((ostream *)local_958,"Too many input files");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_978,"x2x",&local_979);
      sptk::PrintErrorMessage(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      std::__cxx11::string::~string(local_978);
      std::allocator<char>::~allocator((allocator<char> *)&local_979);
      local_4 = 1;
      local_258 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_958);
      goto LAB_0010badf;
    }
    local_5e8 = local_5f8;
  }
  local_5ec = local_5ec + -1;
  goto LAB_0010afd4;
switchD_0010a884_caseD_66:
  std::__cxx11::string::operator=(local_40,ya_optarg);
  std::__cxx11::string::substr((ulong)local_440,(ulong)local_40);
  bVar3 = std::operator!=((char *)in_stack_ffffffffffffec80,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffec7c,in_stack_ffffffffffffec78));
  std::__cxx11::string::~string(local_440);
  if (bVar3) goto LAB_0010ae15;
  goto LAB_0010a79f;
LAB_0010ae15:
  std::__cxx11::ostringstream::ostringstream(local_5b8);
  std::operator<<((ostream *)local_5b8,"The argument for the -f option must be begin with %");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"x2x",&local_5d9);
  sptk::PrintErrorMessage(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  local_4 = 1;
  local_258 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_5b8);
  goto LAB_0010badf;
LAB_0010b3cf:
  bVar3 = sptk::SetBinaryMode();
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream(local_af8);
    std::operator<<((ostream *)local_af8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b18,"x2x",&local_b19);
    sptk::PrintErrorMessage(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
    std::__cxx11::string::~string(local_b18);
    std::allocator<char>::~allocator((allocator<char> *)&local_b19);
    local_4 = 1;
    local_258 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_af8);
    goto LAB_0010badf;
  }
  std::ifstream::ifstream(local_d28);
  pcVar2 = local_5e8;
  if (local_5e8 == (char *)0x0) {
LAB_0010b6cf:
    bVar4 = std::ifstream::is_open();
    if ((bVar4 & 1) == 0) {
      local_1358 = (char *)&std::cin;
    }
    else {
      local_1358 = local_d28;
    }
    local_ed0 = local_1358;
    std::__cxx11::string::substr((ulong)local_ef0,(ulong)local_78);
    std::__cxx11::string::substr((ulong)local_f10,(ulong)local_78);
    anon_unknown.dwarf_1a9d::DataTransformWrapper::DataTransformWrapper
              (_input_data_type,in_stack_00000490,in_stack_00000488,in_stack_00000480,
               in_stack_0000047c,_output_data_type,data_transform.data_transform_._7_1_);
    bVar3 = anon_unknown.dwarf_1a9d::DataTransformWrapper::IsValid(&local_f18);
    if (bVar3) {
      bVar3 = anon_unknown.dwarf_1a9d::DataTransformWrapper::Run
                        ((DataTransformWrapper *)
                         CONCAT44(in_stack_ffffffffffffec94,in_stack_ffffffffffffec90),
                         (istream *)in_stack_ffffffffffffec88);
      if (bVar3) {
        local_4 = 0;
        local_258 = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1230);
        std::operator<<((ostream *)local_1230,"Failed to transform");
        paVar8 = &local_1251;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1250,"x2x",paVar8);
        sptk::PrintErrorMessage(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
        std::__cxx11::string::~string(local_1250);
        std::allocator<char>::~allocator((allocator<char> *)&local_1251);
        local_4 = 1;
        local_258 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1230);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xffffffffffffef70);
      std::operator<<((ostream *)&stack0xffffffffffffef70,"Unexpected argument for the +type option"
                     );
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_10b0,"x2x",&local_10b1);
      sptk::PrintErrorMessage(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
      std::__cxx11::string::~string(local_10b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_10b1);
      local_4 = 1;
      local_258 = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xffffffffffffef70);
    }
    anon_unknown.dwarf_1a9d::DataTransformWrapper::~DataTransformWrapper(in_stack_ffffffffffffec80);
    std::__cxx11::string::~string(local_f10);
    std::__cxx11::string::~string(local_ef0);
  }
  else {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_d28,(_Ios_Openmode)pcVar2);
    bVar4 = std::ios::fail();
    if ((bVar4 & 1) == 0) goto LAB_0010b6cf;
    std::__cxx11::ostringstream::ostringstream(local_ea0);
    poVar7 = std::operator<<((ostream *)local_ea0,"Cannot open file ");
    std::operator<<(poVar7,local_5e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ec0,"x2x",&local_ec1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
    std::__cxx11::string::~string(local_ec0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
    local_4 = 1;
    local_258 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_ea0);
  }
  std::ifstream::~ifstream(local_d28);
LAB_0010badf:
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  bool rounding_flag(kDefaultRoundingFlag);
  WarningType warning_type(kDefaultWarningType);
  int num_column(kDefaultNumColumn);
  std::string print_format("");
  std::string data_types(kDefaultDataTypes);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "re:c:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'r': {
        rounding_flag = true;
        break;
      }
      case 'e': {
        const int min(0);
        const int max(static_cast<int>(kNumWarningTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        warning_type = static_cast<WarningType>(tmp);
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &num_column) ||
            num_column <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        print_format = optarg;
        if ("%" != print_format.substr(0, 1)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -f option must be begin with %";
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_types = str.substr(1, std::string::npos);
      if (2 != data_types.size()) {
        std::ostringstream error_message;
        error_message << "The +type option must be two characters";
        sptk::PrintErrorMessage("x2x", error_message);
        return 1;
      }
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("x2x", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("x2x", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const std::string input_data_type(data_types.substr(0, 1));
  const std::string output_data_type(data_types.substr(1, 1));
  DataTransformWrapper data_transform(input_data_type, output_data_type,
                                      print_format, num_column, warning_type,
                                      rounding_flag);

  if (!data_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  if (!data_transform.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to transform";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  return 0;
}